

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  undefined8 uVar7;
  ushort uVar8;
  ushort *puVar9;
  char *__dest;
  ushort *puVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  BYTE *s_1;
  size_t __n;
  char *pcVar14;
  char cVar15;
  BYTE *d_1;
  char *pcVar16;
  char *pcVar17;
  long lStack_60;
  int local_58;
  BYTE *oCopyLimit;
  
  puVar10 = (ushort *)0xffffffffffffffff;
  if (-1 < maxDecompressedSize && source != (char *)0x0) {
    if (maxDecompressedSize == 0) {
      if (compressedSize == 1) {
        puVar10 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      pcVar3 = dest + (uint)maxDecompressedSize;
      pcVar1 = pcVar3 + -7;
      puVar10 = (ushort *)source;
      __dest = dest;
LAB_001022fe:
      do {
        puVar9 = (ushort *)((long)puVar10 + 1);
        bVar4 = (byte)*puVar10;
        __n = (size_t)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          lStack_60 = -1;
          if (puVar9 < pbVar2 + -0xf) {
            lStack_60 = 0;
            puVar10 = puVar10 + 1;
            do {
              puVar9 = puVar10;
              if (pbVar2 + -0xf < puVar9) {
                lStack_60 = -1;
                break;
              }
              lStack_60 = lStack_60 + (ulong)*(byte *)((long)puVar9 + -1);
              puVar10 = (ushort *)((long)puVar9 + 1);
            } while ((ulong)*(byte *)((long)puVar9 + -1) == 0xff);
          }
          puVar10 = puVar9;
          cVar15 = '\x05';
          __n = 0xf;
          if ((lStack_60 != -1) && (__n = lStack_60 + 0xf, !CARRY8((ulong)__dest,__n))) {
            cVar15 = CARRY8((ulong)puVar10,__n) * '\x05';
          }
          puVar9 = puVar10;
          if (cVar15 != '\0') {
            if (cVar15 != '\x05') goto LAB_001025c6;
            goto LAB_001025c1;
          }
LAB_00102377:
          puVar10 = puVar9;
          pcVar16 = __dest + __n;
          if ((pcVar3 + -0xc < pcVar16) ||
             (puVar9 = (ushort *)((long)puVar10 + __n), pbVar2 + -8 < puVar9)) {
            if (((byte *)((long)puVar10 + __n) != pbVar2) || (pcVar3 < pcVar16)) goto LAB_001025c1;
            memmove(__dest,puVar10,__n);
            puVar10 = (ushort *)(ulong)(uint)((int)pcVar16 - (int)dest);
            goto LAB_001025c6;
          }
          do {
            *(undefined8 *)__dest = *(undefined8 *)puVar10;
            __dest = __dest + 8;
            puVar10 = puVar10 + 4;
          } while (__dest < pcVar16);
          uVar5 = *puVar9;
          puVar10 = puVar9 + 1;
          pcVar14 = pcVar16 + -(ulong)uVar5;
          uVar11 = (ulong)(bVar4 & 0xf);
        }
        else {
          if ((source + (long)compressedSize + -0x10 <= puVar9) ||
             (dest + ((ulong)(uint)maxDecompressedSize - 0x20) < __dest)) goto LAB_00102377;
          uVar7 = *(undefined8 *)((long)puVar10 + 9);
          *(undefined8 *)__dest = *(undefined8 *)puVar9;
          *(undefined8 *)(__dest + 8) = uVar7;
          pcVar16 = __dest + __n;
          uVar11 = (ulong)(bVar4 & 0xf);
          puVar10 = (ushort *)((long)puVar9 + __n) + 1;
          uVar5 = *(ushort *)((long)puVar9 + __n);
          pcVar14 = pcVar16 + -(ulong)uVar5;
          if ((uVar11 != 0xf) && ((7 < uVar5 && (dest <= pcVar14)))) {
            *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
            *(undefined8 *)(pcVar16 + 8) = *(undefined8 *)(pcVar14 + 8);
            *(undefined2 *)(pcVar16 + 0x10) = *(undefined2 *)(pcVar14 + 0x10);
            __dest = pcVar16 + uVar11 + 4;
            goto LAB_001022fe;
          }
        }
        if ((int)uVar11 == 0xf) {
          lStack_60 = 0;
          puVar9 = puVar10;
          do {
            puVar10 = (ushort *)((long)puVar9 + 1);
            if (pbVar2 + -4 < puVar10) {
              lStack_60 = -1;
              break;
            }
            uVar8 = *puVar9;
            lStack_60 = lStack_60 + (ulong)(byte)uVar8;
            puVar9 = puVar10;
          } while ((ulong)(byte)uVar8 == 0xff);
          uVar11 = lStack_60 + 0xf;
          if ((lStack_60 == -1) || (CARRY8((ulong)pcVar16,uVar11))) goto LAB_001025c1;
        }
        if (pcVar14 < dest) goto LAB_001025c1;
        if (uVar5 < 8) {
          pcVar16[0] = '\0';
          pcVar16[1] = '\0';
          pcVar16[2] = '\0';
          pcVar16[3] = '\0';
          *pcVar16 = *pcVar14;
          pcVar16[1] = pcVar14[1];
          pcVar16[2] = pcVar14[2];
          pcVar16[3] = pcVar14[3];
          uVar6 = inc32table[uVar5];
          *(undefined4 *)(pcVar16 + 4) = *(undefined4 *)(pcVar14 + uVar6);
          pcVar14 = pcVar14 + ((ulong)uVar6 - (long)dec64table[uVar5]);
        }
        else {
          *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
          pcVar14 = pcVar14 + 8;
        }
        __dest = pcVar16 + uVar11 + 4;
        pcVar12 = pcVar16 + 8;
        if (__dest <= pcVar3 + -0xc) {
          *(undefined8 *)pcVar12 = *(undefined8 *)pcVar14;
          if (0x10 < uVar11 + 4) {
            pcVar16 = pcVar16 + 0x10;
            do {
              pcVar14 = pcVar14 + 8;
              *(undefined8 *)pcVar16 = *(undefined8 *)pcVar14;
              pcVar16 = pcVar16 + 8;
            } while (pcVar16 < __dest);
          }
          goto LAB_001022fe;
        }
        iVar13 = 5;
        if (__dest <= pcVar3 + -5) {
          pcVar16 = pcVar14;
          pcVar17 = pcVar12;
          if (pcVar12 < pcVar1) {
            do {
              *(undefined8 *)pcVar17 = *(undefined8 *)pcVar16;
              pcVar17 = pcVar17 + 8;
              pcVar16 = pcVar16 + 8;
            } while (pcVar17 < pcVar1);
            pcVar14 = pcVar14 + ((long)pcVar1 - (long)pcVar12);
            pcVar12 = pcVar1;
          }
          iVar13 = 0;
          for (; pcVar12 < __dest; pcVar12 = pcVar12 + 1) {
            cVar15 = *pcVar14;
            pcVar14 = pcVar14 + 1;
            *pcVar12 = cVar15;
          }
        }
      } while (iVar13 == 0);
      if (iVar13 == 5) {
LAB_001025c1:
        local_58 = (int)source;
        puVar10 = (ushort *)(ulong)(~(uint)puVar10 + local_58);
      }
    }
  }
LAB_001025c6:
  return (int)puVar10;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize,
                                  decode_full_block, noDict,
                                  (BYTE*)dest, NULL, 0);
}